

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Point3fi * __thiscall
pbrt::Transform::ApplyInverse(Point3fi *__return_storage_ptr__,Transform *this,Point3fi *p)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Interval IVar34;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar35 [64];
  undefined1 auStack_98 [8];
  Tuple3<pbrt::Vector3,_float> local_90;
  Interval local_80;
  undefined1 local_78 [16];
  Interval local_68;
  undefined8 uStack_60;
  Interval local_58;
  undefined8 uStack_50;
  Point3fi local_40;
  Point3f local_24;
  undefined1 extraout_var [56];
  
  bVar10 = &stack0x00000000 != (undefined1 *)0x98;
  bVar9 = (POPCOUNT((ulong)auStack_98 & 0xff) & 1U) == 0;
  FVar1 = (this->mInv).m[0][0];
  FVar2 = (this->mInv).m[0][2];
  FVar3 = (this->mInv).m[1][0];
  FVar4 = (this->mInv).m[1][2];
  fVar5 = (this->mInv).m[2][0];
  fVar6 = (this->mInv).m[2][2];
  auVar24 = vinsertps_avx512f(*(undefined1 (*) [16])((this->mInv).m[0] + 1),
                              ZEXT416((uint)(this->mInv).m[1][1]),0x10);
  auVar12 = ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low);
  auVar13 = ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high);
  auVar11 = vaddss_avx512f(auVar12,auVar13);
  vsubss_avx512f(auVar13,auVar12);
  auVar13 = ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low);
  auVar14 = ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high);
  auVar12 = vsubss_avx512f(auVar14,auVar13);
  fVar7 = auVar11._0_4_ * 0.5;
  auVar11 = vaddss_avx512f(auVar13,auVar14);
  auVar14 = ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low);
  auVar15 = ZEXT416((uint)(p->super_Point3<pbrt::Interval>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high);
  auVar13 = vsubss_avx512f(auVar15,auVar14);
  auVar28 = SUB6416(ZEXT464(0x3f000000),0);
  auVar11 = vmulss_avx512f(auVar11,auVar28);
  auVar14 = vaddss_avx512f(auVar14,auVar15);
  auVar15 = vbroadcastss_avx512vl(auVar11);
  auVar32 = ZEXT416((uint)(this->mInv).m[2][1]);
  auVar16 = vmulss_avx512f(auVar11,auVar32);
  auVar11 = vmulss_avx512f(auVar11,ZEXT416((uint)(this->mInv).m[3][1]));
  fVar8 = auVar14._0_4_ * 0.5;
  auVar17 = vfmadd213ss_avx512f(ZEXT416((uint)(this->mInv).m[3][2]),ZEXT416((uint)fVar8),
                                ZEXT416((uint)(this->mInv).m[3][3]));
  auVar18 = vmulps_avx512vl(auVar15,auVar24);
  auVar25 = ZEXT416((uint)fVar7);
  auVar19 = vfmadd231ss_avx512f(auVar11,auVar25,ZEXT416((uint)(this->mInv).m[3][0]));
  auVar30 = ZEXT416((uint)fVar8);
  auVar29 = ZEXT416((uint)(this->mInv).m[0][3]);
  auVar20 = vfmadd213ss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)FVar2),auVar29);
  auVar31 = ZEXT416((uint)(this->mInv).m[1][3]);
  auVar21 = vfmadd213ss_avx512f(auVar30,ZEXT416((uint)FVar4),auVar31);
  auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar5),auVar16);
  auVar33 = ZEXT416((uint)(this->mInv).m[2][3]);
  auVar15 = vfmadd213ss_fma(auVar30,ZEXT416((uint)fVar6),auVar33);
  auVar11 = vmovshdup_avx(auVar18);
  auVar22 = vfmadd213ss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)FVar1),auVar18);
  auVar23 = vfmadd231ss_avx512f(auVar11,ZEXT416((uint)FVar3),auVar25);
  vaddss_avx512f(auVar19,auVar17);
  auVar17 = vxorps_avx512vl(auVar19,auVar19);
  auVar11 = vucomiss_avx512f(auVar17);
  if (((((bVar10) || (bVar9)) || (auVar12 = vucomiss_avx512f(auVar17), bVar10)) ||
      ((bVar9 || (auVar13 = vucomiss_avx512f(auVar17), bVar10)))) || (bVar9)) {
    auVar19 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar25 = vbroadcastss_avx512vl(auVar25);
    auVar17 = vinsertps_avx512f(ZEXT416((uint)FVar1),ZEXT416((uint)FVar3),0x10);
    auVar26 = vmulss_avx512f(auVar11,auVar28);
    auVar27 = vmulss_avx512f(auVar12,auVar28);
    auVar13 = vmulss_avx512f(auVar13,auVar28);
    auVar11 = vinsertps_avx512f(ZEXT416((uint)FVar2),ZEXT416((uint)FVar4),0x10);
    auVar12 = vinsertps_avx512f(auVar29,auVar31,0x10);
    auVar28 = vbroadcastss_avx512vl(auVar27);
    auVar29 = vandps_avx512vl(auVar17,auVar19);
    auVar17 = vmulps_avx512vl(auVar25,auVar17);
    auVar25 = vbroadcastss_avx512vl(auVar30);
    auVar30 = vandps_avx512vl(auVar11,auVar19);
    auVar18 = vandps_avx512vl(auVar18,auVar19);
    auVar24 = vandps_avx512vl(auVar24,auVar19);
    auVar12 = vandps_avx512vl(auVar12,auVar19);
    auVar31 = vandps_avx512vl(ZEXT416((uint)(fVar5 * fVar7)),auVar19);
    auVar16 = vandps_avx512vl(auVar16,auVar19);
    auVar32 = vandps_avx512vl(auVar32,auVar19);
    auVar24 = vmulps_avx512vl(auVar24,auVar28);
    auVar28 = vbroadcastss_avx512vl(auVar26);
    auVar32 = vmulss_avx512f(auVar32,auVar27);
    auVar11 = vmulps_avx512vl(auVar25,auVar11);
    auVar17 = vandps_avx512vl(auVar17,auVar19);
    auVar25 = vandps_avx512vl(ZEXT416((uint)(fVar6 * fVar8)),auVar19);
    auVar17 = vaddps_avx512vl(auVar17,auVar18);
    auVar24 = vfmadd213ps_avx512vl(auVar28,auVar29,auVar24);
    auVar18 = vbroadcastss_avx512vl(auVar13);
    auVar33 = vandps_avx512vl(auVar33,auVar19);
    auVar11 = vandps_avx512vl(auVar11,auVar19);
    auVar28._0_4_ = auVar17._0_4_ + auVar11._0_4_;
    auVar28._4_4_ = auVar17._4_4_ + auVar11._4_4_;
    auVar28._8_4_ = auVar17._8_4_ + auVar11._8_4_;
    auVar28._12_4_ = auVar17._12_4_ + auVar11._12_4_;
    auVar17 = vfmadd213ps_avx512vl(auVar18,auVar30,auVar24);
    auVar24 = vaddps_avx512vl(auVar12,auVar28);
    auVar11._8_4_ = 0x34400002;
    auVar11._0_8_ = 0x3440000234400002;
    auVar11._12_4_ = 0x34400002;
    auVar11 = vmulps_avx512vl(auVar24,auVar11);
    auVar24._8_4_ = 0x3f800002;
    auVar24._0_8_ = 0x3f8000023f800002;
    auVar24._12_4_ = 0x3f800002;
    auVar11 = vfmadd231ps_avx512vl(auVar11,auVar17,auVar24);
    local_90._0_8_ = vmovlps_avx(auVar11);
    auVar11 = vandps_avx512vl(ZEXT416((uint)fVar5),auVar19);
    auVar11 = vfmadd231ss_avx512f(auVar32,auVar26,auVar11);
    auVar24 = vandps_avx512vl(ZEXT416((uint)fVar6),auVar19);
    auVar11 = vfmadd213ss_fma(auVar24,auVar13,auVar11);
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((auVar33._0_4_ +
                                             auVar16._0_4_ + auVar31._0_4_ + auVar25._0_4_) *
                                            1.7881396e-07)),auVar11,ZEXT416(0x3f800002));
    local_90.z = auVar11._0_4_;
  }
  else {
    auVar12 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar11 = vinsertps_avx512f(ZEXT416((uint)FVar1),ZEXT416((uint)FVar3),0x10);
    auVar24 = vinsertps_avx512f(ZEXT416((uint)FVar2),ZEXT416((uint)FVar4),0x10);
    auVar13._0_4_ = fVar7 * auVar11._0_4_;
    auVar13._4_4_ = fVar7 * auVar11._4_4_;
    auVar13._8_4_ = fVar7 * auVar11._8_4_;
    auVar13._12_4_ = fVar7 * auVar11._12_4_;
    auVar19._0_4_ = fVar8 * auVar24._0_4_;
    auVar19._4_4_ = fVar8 * auVar24._4_4_;
    auVar19._8_4_ = fVar8 * auVar24._8_4_;
    auVar19._12_4_ = fVar8 * auVar24._12_4_;
    auVar11 = vandps_avx512vl(auVar18,auVar12);
    auVar24 = vandps_avx512vl(auVar13,auVar12);
    auVar13 = vandps_avx512vl(ZEXT416((uint)(fVar5 * fVar7)),auVar12);
    auVar16 = vandps_avx512vl(auVar16,auVar12);
    auVar17 = vandps_avx512vl(ZEXT416((uint)(fVar6 * fVar8)),auVar12);
    auVar12 = vandps_avx512vl(auVar19,auVar12);
    auVar18._0_4_ = auVar24._0_4_ + auVar11._0_4_ + auVar12._0_4_;
    auVar18._4_4_ = auVar24._4_4_ + auVar11._4_4_ + auVar12._4_4_;
    auVar18._8_4_ = auVar24._8_4_ + auVar11._8_4_ + auVar12._8_4_;
    auVar18._12_4_ = auVar24._12_4_ + auVar11._12_4_ + auVar12._12_4_;
    auVar12._8_4_ = 0x34400002;
    auVar12._0_8_ = 0x3440000234400002;
    auVar12._12_4_ = 0x34400002;
    auVar11 = vmulps_avx512vl(auVar18,auVar12);
    local_90.z = (auVar16._0_4_ + auVar13._0_4_ + auVar17._0_4_) * 1.7881396e-07;
    local_90._0_8_ = vmovlps_avx(auVar11);
  }
  local_78 = vucomiss_avx512f(ZEXT416(0x3f800000));
  local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
       auVar22._0_4_ + auVar20._0_4_;
  local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
       auVar23._0_4_ + auVar21._0_4_;
  local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
       auVar14._0_4_ + auVar15._0_4_;
  if ((bVar10) || (bVar9)) {
    local_24.super_Tuple3<pbrt::Point3,_float>.x =
         local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    local_24.super_Tuple3<pbrt::Point3,_float>.y =
         local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    local_24.super_Tuple3<pbrt::Point3,_float>.z =
         local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    Point3fi::Point3fi(&local_40,&local_24,(Vector3f *)&local_90);
    IVar34.high = (Float)local_78._0_4_;
    IVar34.low = (Float)local_78._0_4_;
    local_78._8_4_ = local_78._0_4_;
    local_78._4_4_ = local_78._0_4_;
    local_78._12_4_ = local_78._0_4_;
    local_58 = Interval::operator/(&local_80,IVar34);
    uStack_50 = extraout_XMM0_Qb;
    local_68 = Interval::operator/(&local_80,(Interval)local_78._0_8_);
    local_80 = local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    uStack_60 = extraout_XMM0_Qb_00;
    auVar35._0_8_ = Interval::operator/(&local_80,(Interval)local_78._0_8_);
    auVar35._8_56_ = extraout_var;
    auVar15._8_8_ = uStack_50;
    auVar15._0_4_ = local_58.low;
    auVar15._4_4_ = local_58.high;
    auVar14._8_8_ = uStack_60;
    auVar14._0_4_ = local_68.low;
    auVar14._4_4_ = local_68.high;
    auVar11 = vunpcklpd_avx(auVar15,auVar14);
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)(int)auVar11._0_8_;
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)(int)((ulong)auVar11._0_8_ >> 0x20);
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)(int)auVar11._8_8_;
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)(int)((ulong)auVar11._8_8_ >> 0x20);
    IVar34 = (Interval)vmovlps_avx(auVar35._0_16_);
    (__return_storage_ptr__->super_Point3<pbrt::Interval>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IVar34;
  }
  else {
    Point3fi::Point3fi(__return_storage_ptr__,(Point3f *)0x58,(Vector3f *)0x8);
  }
  return __return_storage_ptr__;
}

Assistant:

Point3fi Transform::ApplyInverse(const Point3fi &p) const {
    Float x = Float(p.x), y = Float(p.y), z = Float(p.z);
    // Compute transformed coordinates from point _pt_
    Float xp = (mInv[0][0] * x + mInv[0][1] * y) + (mInv[0][2] * z + mInv[0][3]);
    Float yp = (mInv[1][0] * x + mInv[1][1] * y) + (mInv[1][2] * z + mInv[1][3]);
    Float zp = (mInv[2][0] * x + mInv[2][1] * y) + (mInv[2][2] * z + mInv[2][3]);
    Float wp = (mInv[3][0] * x + mInv[3][1] * y) + (mInv[3][2] * z + mInv[3][3]);

    // Compute absolute error for transformed point
    Vector3f pOutError;
    if (p.IsExact()) {
        pOutError.x = gamma(3) * (std::abs(mInv[0][0] * x) + std::abs(mInv[0][1] * y) +
                                  std::abs(mInv[0][2] * z));
        pOutError.y = gamma(3) * (std::abs(mInv[1][0] * x) + std::abs(mInv[1][1] * y) +
                                  std::abs(mInv[1][2] * z));
        pOutError.z = gamma(3) * (std::abs(mInv[2][0] * x) + std::abs(mInv[2][1] * y) +
                                  std::abs(mInv[2][2] * z));
    } else {
        Vector3f pInError = p.Error();
        pOutError.x = (gamma(3) + 1) * (std::abs(mInv[0][0]) * pInError.x +
                                        std::abs(mInv[0][1]) * pInError.y +
                                        std::abs(mInv[0][2]) * pInError.z) +
                      gamma(3) * (std::abs(mInv[0][0] * x) + std::abs(mInv[0][1] * y) +
                                  std::abs(mInv[0][2] * z) + std::abs(mInv[0][3]));
        pOutError.y = (gamma(3) + 1) * (std::abs(mInv[1][0]) * pInError.x +
                                        std::abs(mInv[1][1]) * pInError.y +
                                        std::abs(mInv[1][2]) * pInError.z) +
                      gamma(3) * (std::abs(mInv[1][0] * x) + std::abs(mInv[1][1] * y) +
                                  std::abs(mInv[1][2] * z) + std::abs(mInv[1][3]));
        pOutError.z = (gamma(3) + 1) * (std::abs(mInv[2][0]) * pInError.x +
                                        std::abs(mInv[2][1]) * pInError.y +
                                        std::abs(mInv[2][2]) * pInError.z) +
                      gamma(3) * (std::abs(mInv[2][0] * x) + std::abs(mInv[2][1] * y) +
                                  std::abs(mInv[2][2] * z) + std::abs(mInv[2][3]));
    }

    if (wp == 1)
        return Point3fi(Point3f(xp, yp, zp), pOutError);
    else
        return Point3fi(Point3f(xp, yp, zp), pOutError) / wp;
}